

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O0

void __thiscall cmCTestBZR::LoadRevisions(cmCTestBZR *this)

{
  cmCTest *pcVar1;
  int iVar2;
  int iVar3;
  ostream *this_00;
  char *pcVar4;
  string local_6d8 [32];
  ostringstream local_6b8 [8];
  ostringstream cmCTestLog_msg_1;
  undefined1 local_540 [8];
  OutputLogger err;
  LogParser out;
  char *bzr_log [8];
  char *bzr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8 [8];
  string revs;
  ostringstream local_188 [8];
  ostringstream cmCTestLog_msg;
  cmCTestBZR *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  this_00 = std::operator<<((ostream *)local_188,
                            "   Gathering version information (one . per revision):\n    ");
  std::ostream::operator<<(this_00,std::flush<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestBZR.cxx"
               ,0x1ba,pcVar4,false);
  std::__cxx11::string::~string((string *)(revs.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream(local_188);
  std::__cxx11::list<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::clear
            (&(this->super_cmCTestGlobalVC).Revisions);
  std::__cxx11::string::string(local_1d8);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar2 = atoi(pcVar4);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar3 = atoi(pcVar4);
  if (iVar2 <= iVar3) {
    std::operator+(&local_218,&(this->super_cmCTestGlobalVC).OldRevision,"..");
    std::operator+(&local_1f8,&local_218,&(this->super_cmCTestGlobalVC).NewRevision);
    std::__cxx11::string::operator=(local_1d8,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
    out.EmailRegex.searchstring = (char *)std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    LogParser::LogParser((LogParser *)&err.super_LineParser.Separator,this,"log-out> ");
    cmProcessTools::OutputLogger::OutputLogger
              ((OutputLogger *)local_540,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
               "log-err> ");
    cmCTestVC::RunChild((cmCTestVC *)this,&out.EmailRegex.searchstring,
                        (OutputParser *)&err.super_LineParser.Separator,(OutputParser *)local_540,
                        (char *)0x0);
    cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_540);
    LogParser::~LogParser((LogParser *)&err.super_LineParser.Separator);
    std::__cxx11::ostringstream::ostringstream(local_6b8);
    std::ostream::operator<<(local_6b8,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestBZR.cxx"
                 ,0x1d2,pcVar4,false);
    std::__cxx11::string::~string(local_6d8);
    std::__cxx11::ostringstream::~ostringstream(local_6b8);
  }
  std::__cxx11::string::~string(local_1d8);
  return;
}

Assistant:

void cmCTestBZR::LoadRevisions()
{
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   Gathering version information (one . per revision):\n"
             "    " << std::flush);

  // We are interested in every revision included in the update.
  this->Revisions.clear();
  std::string revs;
  if(atoi(this->OldRevision.c_str()) <= atoi(this->NewRevision.c_str()))
    {
    // DoRevision takes care of discarding the information about OldRevision
    revs = this->OldRevision + ".." + this->NewRevision;
    }
  else
    {
    return;
    }

  // Run "bzr log" to get all global revisions of interest.
  const char* bzr = this->CommandLineTool.c_str();
  const char* bzr_log[] = {bzr, "log", "-v", "-r", revs.c_str(), "--xml",
                           this->URL.c_str(), 0};
  {
  LogParser out(this, "log-out> ");
  OutputLogger err(this->Log, "log-err> ");
  this->RunChild(bzr_log, &out, &err);
  }
  cmCTestLog(this->CTest, HANDLER_OUTPUT, std::endl);
}